

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O1

void __thiscall isSameTopology::test_method(isSameTopology *this)

{
  CartesianProduct cp2;
  CartesianProduct cp;
  CartesianProduct cp2b;
  SO3<mnf::ExpMapMatrix> so3M;
  S2 s2;
  CartesianProduct cpb;
  RealSpace R9;
  SO3<mnf::ExpMapQuaternion> so3Q;
  RealSpace R3;
  RealSpace R9b;
  shared_count sStack_798;
  char *local_790;
  char *local_788;
  undefined **local_780;
  undefined1 local_778;
  undefined8 *local_770;
  char **local_768;
  code *local_760 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_708 [24];
  void *local_6f0;
  void *local_6d8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  code *local_540 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_4e8 [24];
  void *local_4d0;
  void *local_4b8;
  code *local_4a0 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_448 [24];
  void *local_430;
  void *local_418;
  SO3<mnf::ExpMapMatrix> local_400;
  S2 local_360 [136];
  code *local_2d8 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_280 [24];
  void *local_268;
  void *local_250;
  code *local_238 [11];
  void *local_1e0;
  void *local_1d0;
  SO3<mnf::ExpMapQuaternion> local_1c0;
  code *local_120 [11];
  void *local_c8;
  void *local_b8;
  code *local_a8 [11];
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_238,9);
  mnf::RealSpace::RealSpace((RealSpace *)local_a8,9);
  mnf::RealSpace::RealSpace((RealSpace *)local_120,3);
  mnf::S2::S2(local_360);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_400);
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&local_1c0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_540,&local_400.super_Manifold,(Manifold *)local_238);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_760,(Manifold *)local_540,(Manifold *)local_360);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_2d8,&local_400.super_Manifold,(Manifold *)local_a8);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_4a0,(Manifold *)local_540,(Manifold *)local_360);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x236);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(R9)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_568 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x237);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(R3)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_598 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5b0,0x238);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(s2)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5c8 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5e0,0x239);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(so3M)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_5f8 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_610,0x23a);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(so3Q)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_628 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_640,0x23b);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "!cp2.isSameTopology(cp)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_658 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_670,0x23c);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "cp2.isSameTopology(cp2)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_688 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_6a0,0x23d);
  mnf::CartesianProduct::isSameTopology((Manifold *)local_760);
  sStack_798.pi_ = (sp_counted_base *)0x0;
  local_790 = "cp2.isSameTopology(cp2b)";
  local_788 = "";
  local_778 = 0;
  local_780 = &PTR__lazy_ostream_00144b88;
  local_770 = &boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
  ;
  local_6b8 = "";
  local_768 = &local_790;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_798);
  local_4a0[0] = free;
  if (local_418 != (void *)0x0) {
    operator_delete(local_418);
  }
  if (local_430 != (void *)0x0) {
    operator_delete(local_430);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_448);
  mnf::Manifold::~Manifold((Manifold *)local_4a0);
  local_2d8[0] = free;
  if (local_250 != (void *)0x0) {
    operator_delete(local_250);
  }
  if (local_268 != (void *)0x0) {
    operator_delete(local_268);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_280);
  mnf::Manifold::~Manifold((Manifold *)local_2d8);
  local_760[0] = free;
  if (local_6d8 != (void *)0x0) {
    operator_delete(local_6d8);
  }
  if (local_6f0 != (void *)0x0) {
    operator_delete(local_6f0);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_708);
  mnf::Manifold::~Manifold((Manifold *)local_760);
  local_540[0] = free;
  if (local_4b8 != (void *)0x0) {
    operator_delete(local_4b8);
  }
  if (local_4d0 != (void *)0x0) {
    operator_delete(local_4d0);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_4e8);
  mnf::Manifold::~Manifold((Manifold *)local_540);
  local_1c0._0_8_ = &PTR__SO3_00144878;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap
            ((ReusableTemporaryMap *)((long)&local_1c0 + 0x58));
  mnf::Manifold::~Manifold(&local_1c0.super_Manifold);
  local_400._0_8_ = &PTR__SO3_00144670;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap
            ((ReusableTemporaryMap *)((long)&local_400 + 0x58));
  mnf::Manifold::~Manifold(&local_400.super_Manifold);
  mnf::Manifold::~Manifold((Manifold *)local_360);
  local_120[0] = std::terminate;
  free(local_b8);
  free(local_c8);
  mnf::Manifold::~Manifold((Manifold *)local_120);
  local_a8[0] = std::terminate;
  free(local_40);
  free(local_50);
  mnf::Manifold::~Manifold((Manifold *)local_a8);
  local_238[0] = std::terminate;
  free(local_1d0);
  free(local_1e0);
  mnf::Manifold::~Manifold((Manifold *)local_238);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(isSameTopology)
{
  RealSpace R9(9);
  RealSpace R9b(9);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapMatrix> so3M;
  SO3<ExpMapQuaternion> so3Q;
  CartesianProduct cp(so3M, R9);
  CartesianProduct cp2(cp, s2);
  CartesianProduct cpb(so3M, R9b);
  CartesianProduct cp2b(cp, s2);

  BOOST_CHECK(!cp2.isSameTopology(R9));
  BOOST_CHECK(!cp2.isSameTopology(R3));
  BOOST_CHECK(!cp2.isSameTopology(s2));
  BOOST_CHECK(!cp2.isSameTopology(so3M));
  BOOST_CHECK(!cp2.isSameTopology(so3Q));
  BOOST_CHECK(!cp2.isSameTopology(cp));
  BOOST_CHECK(cp2.isSameTopology(cp2));
  BOOST_CHECK(cp2.isSameTopology(cp2b));
}